

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_header.c
# Opt level: O0

exr_result_t save_v3f(_internal_exr_context *ctxt,exr_attribute_t *a)

{
  exr_result_t eVar1;
  long in_RSI;
  exr_attr_v3f_t tmp;
  exr_result_t rv;
  void *in_stack_ffffffffffffffd8;
  _internal_exr_context *ctxt_00;
  undefined4 in_stack_ffffffffffffffec;
  
  ctxt_00 = (_internal_exr_context *)**(size_t **)(in_RSI + 0x18);
  eVar1 = save_attr_sz((_internal_exr_context *)
                       CONCAT44(in_stack_ffffffffffffffec,(int)(*(size_t **)(in_RSI + 0x18))[1]),
                       (size_t)ctxt_00);
  if (eVar1 == 0) {
    eVar1 = save_attr_32(ctxt_00,in_stack_ffffffffffffffd8,0);
  }
  return eVar1;
}

Assistant:

static exr_result_t
save_v3f (struct _internal_exr_context* ctxt, const exr_attribute_t* a)
{
    exr_result_t   rv;
    exr_attr_v3f_t tmp = *(a->v3f);

    rv = save_attr_sz (ctxt, sizeof (exr_attr_v3f_t));
    if (rv == EXR_ERR_SUCCESS) rv = save_attr_32 (ctxt, &tmp, 3);
    return rv;
}